

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuDevice.cpp
# Opt level: O3

void amrex::Gpu::Device::Finalize(void)

{
  return;
}

Assistant:

void
Device::Finalize ()
{

    Device::profilerStop();

    for (int i = 0; i < max_gpu_streams; ++i)
    {
        AMREX_HIP_OR_CUDA( AMREX_HIP_SAFE_CALL( hipStreamDestroy(gpu_stream_pool[i]));,
                          AMREX_CUDA_SAFE_CALL(cudaStreamDestroy(gpu_stream_pool[i])); );
    }

#ifdef AMREX_USE_DPCPP
    sycl_context.reset();
    sycl_device.reset();
    for (auto& s : gpu_stream_pool) {
        delete s.queue;
        s.queue = nullptr;
    }
    gpu_stream.clear();
    delete gpu_default_stream.queue;
    gpu_default_stream.queue = nullptr;
#endif

#ifdef AMREX_USE_ACC
    amrex_finalize_acc();
#endif
}